

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shuffle.h
# Opt level: O1

void shuffle<std::__cxx11::string>
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *array)

{
  pointer pbVar1;
  long lVar2;
  uint uVar3;
  int iVar4;
  time_t tVar5;
  long lVar6;
  long lVar7;
  value_type temp;
  long *local_50 [2];
  long local_40 [2];
  
  if (!shuffle<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
       isInitialized) {
    tVar5 = time((time_t *)0x0);
    srand((uint)tVar5);
    shuffle<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    isInitialized = true;
  }
  uVar3 = (int)((ulong)((long)(array->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish -
                       (long)(array->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start) >> 5) - 1;
  if (0 < (int)uVar3) {
    lVar6 = (ulong)uVar3 + 1;
    lVar7 = (ulong)uVar3 << 5;
    do {
      iVar4 = rand();
      pbVar1 = (array->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      lVar2 = *(long *)((long)&(pbVar1->_M_dataplus)._M_p + lVar7);
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_50,lVar2,*(long *)((long)&pbVar1->_M_string_length + lVar7) + lVar2
                );
      std::__cxx11::string::_M_assign
                ((string *)
                 ((long)&(((array->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar7));
      std::__cxx11::string::_M_assign
                ((string *)
                 ((array->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start + iVar4 % (int)lVar6));
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
      lVar6 = lVar6 + -1;
      lVar7 = lVar7 + -0x20;
    } while (1 < lVar6);
  }
  return;
}

Assistant:

void shuffle(std::vector<T>& array) {
    static bool isInitialized = false;
    if (!isInitialized) {
        srand(time(nullptr));
        isInitialized =  true;
    }
    for(int i = array.size()-1; i > 0; i--) {
        auto randomIndex = rand() % (i + 1);
        auto temp = array[i];
        array[i] = array[randomIndex];
        array[randomIndex] = temp;
    }
}